

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightstobin.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  char **ppcStack_18;
  int opt;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  local_1c = getopt(argc,argv,"vh");
  if (local_1c == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"",&local_79);
    initstreams((string *)local_40,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    doit();
    return 0;
  }
  if ((local_1c != 0x68) && (local_1c == 0x76)) {
    fprintf(_stderr,"%s: version: %s\n",*ppcStack_18,"");
    exit(1);
  }
  help();
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {

  int opt;
  while ((opt = getopt(argc, argv, "vh")) != -1) {
    switch (opt) {
      case 'v':
        fprintf(stderr, "%s: version: %s\n", argv[0], VERSION);
	exit(EXIT_FAILURE);
      case 'h':
      default:
	help();
	exit(EXIT_FAILURE);
    }
  }

  initstreams();
  doit();

  return 0;

}